

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O2

void jas_matrix_divpow2(jas_matrix_t *matrix,int n)

{
  jas_seqent_t **ppjVar1;
  ulong uVar2;
  size_t sVar3;
  ulong *puVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  long lVar8;
  
  lVar8 = matrix->numrows_;
  if ((0 < lVar8) && (0 < matrix->numcols_)) {
    ppjVar1 = matrix->rows_;
    if (ppjVar1 == (jas_seqent_t **)0x0) {
      __assert_fail("matrix->rows_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                    ,0x11b,"void jas_matrix_divpow2(jas_matrix_t *, int)");
    }
    sVar3 = jas_matrix_rowstep(matrix);
    puVar4 = (ulong *)*ppjVar1;
    for (; 0 < lVar8; lVar8 = lVar8 + -1) {
      puVar6 = puVar4;
      for (lVar5 = matrix->numcols_; 0 < lVar5; lVar5 = lVar5 + -1) {
        uVar2 = *puVar6;
        uVar7 = -(-uVar2 >> ((byte)n & 0x3f));
        if (-1 < (long)uVar2) {
          uVar7 = uVar2 >> ((byte)n & 0x3f);
        }
        *puVar6 = uVar7;
        puVar6 = puVar6 + 1;
      }
      puVar4 = puVar4 + sVar3;
    }
  }
  return;
}

Assistant:

void jas_matrix_divpow2(jas_matrix_t *matrix, int n)
{
	jas_matind_t i;
	jas_matind_t j;
	jas_seqent_t *rowstart;
	jas_matind_t rowstep;
	jas_seqent_t *data;

	if (jas_matrix_numrows(matrix) > 0 && jas_matrix_numcols(matrix) > 0) {
		assert(matrix->rows_);
		rowstep = jas_matrix_rowstep(matrix);
		for (i = matrix->numrows_, rowstart = matrix->rows_[0]; i > 0; --i,
		  rowstart += rowstep) {
			for (j = matrix->numcols_, data = rowstart; j > 0; --j,
			  ++data) {
				*data = (*data >= 0) ? ((*data) >> n) :
				  (-((-(*data)) >> n));
			}
		}
	}
}